

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader14.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::NodeLoader14::begin__instance_light
          (NodeLoader14 *this,instance_light__AttributeData *attributeData)

{
  byte bVar1;
  uint *in_RSI;
  long in_RDI;
  instance_light__AttributeData attrData;
  URI *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  uint local_110 [60];
  undefined8 local_20;
  undefined8 local_18;
  uint *local_10;
  
  local_10 = in_RSI;
  instance_light__AttributeData::instance_light__AttributeData
            ((instance_light__AttributeData *)0xbb5f3e);
  local_110[0] = 0;
  local_20 = *(undefined8 *)(local_10 + 0x3c);
  local_18 = *(undefined8 *)(local_10 + 0x3e);
  if ((*local_10 & 1) == 1) {
    COLLADABU::URI::operator=
              ((URI *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8);
    local_110[0] = local_110[0] | 1;
  }
  bVar1 = (**(code **)(**(long **)(in_RDI + 0x18) + 0x120))(*(long **)(in_RDI + 0x18),local_110);
  instance_light__AttributeData::~instance_light__AttributeData
            ((instance_light__AttributeData *)0xbb5fef);
  return (bool)(bVar1 & 1);
}

Assistant:

bool NodeLoader14::begin__instance_light( const COLLADASaxFWL14::instance_light__AttributeData& attributeData )
{
SaxVirtualFunctionTest14(begin__instance_light(attributeData));
COLLADASaxFWL::instance_light__AttributeData attrData;
attrData.present_attributes = 0;
attrData.sid = attributeData.sid;
attrData.name = attributeData.name;
if ( (attributeData.present_attributes & COLLADASaxFWL14::instance_light__AttributeData::ATTRIBUTE_URL_PRESENT) == COLLADASaxFWL14::instance_light__AttributeData::ATTRIBUTE_URL_PRESENT ) {
    attrData.url = attributeData.url;
    attrData.present_attributes |= COLLADASaxFWL::instance_light__AttributeData::ATTRIBUTE_URL_PRESENT;
}
return mLoader->begin__instance_light(attrData);
}